

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCollisionWorld.h
# Opt level: O3

btScalar __thiscall
btCollisionWorld::ClosestConvexResultCallback::addSingleResult
          (ClosestConvexResultCallback *this,LocalConvexResult *convexResult,bool normalInWorldSpace
          )

{
  float fVar1;
  float fVar2;
  float fVar3;
  btCollisionObject *pbVar4;
  undefined1 auVar5 [16];
  undefined8 uVar6;
  undefined3 in_register_00000011;
  
  (this->super_ConvexResultCallback).m_closestHitFraction = convexResult->m_hitFraction;
  pbVar4 = convexResult->m_hitCollisionObject;
  this->m_hitCollisionObject = pbVar4;
  if (CONCAT31(in_register_00000011,normalInWorldSpace) == 0) {
    fVar1 = (convexResult->m_hitNormalLocal).m_floats[0];
    fVar2 = (convexResult->m_hitNormalLocal).m_floats[1];
    fVar3 = (convexResult->m_hitNormalLocal).m_floats[2];
    auVar5._4_4_ = fVar3 * (pbVar4->m_worldTransform).m_basis.m_el[1].m_floats[2] +
                   fVar1 * (pbVar4->m_worldTransform).m_basis.m_el[1].m_floats[0] +
                   (pbVar4->m_worldTransform).m_basis.m_el[1].m_floats[1] * fVar2;
    auVar5._0_4_ = fVar3 * (pbVar4->m_worldTransform).m_basis.m_el[0].m_floats[2] +
                   fVar1 * (pbVar4->m_worldTransform).m_basis.m_el[0].m_floats[0] +
                   (pbVar4->m_worldTransform).m_basis.m_el[0].m_floats[1] * fVar2;
    auVar5._8_4_ = fVar3 * (pbVar4->m_worldTransform).m_basis.m_el[2].m_floats[2] +
                   fVar1 * (pbVar4->m_worldTransform).m_basis.m_el[2].m_floats[0] +
                   fVar2 * (pbVar4->m_worldTransform).m_basis.m_el[2].m_floats[1];
    auVar5._12_4_ = 0;
    *(undefined1 (*) [16])(this->m_hitNormalWorld).m_floats = auVar5;
  }
  else {
    uVar6 = *(undefined8 *)((convexResult->m_hitNormalLocal).m_floats + 2);
    *(undefined8 *)(this->m_hitNormalWorld).m_floats =
         *(undefined8 *)(convexResult->m_hitNormalLocal).m_floats;
    *(undefined8 *)((this->m_hitNormalWorld).m_floats + 2) = uVar6;
  }
  uVar6 = *(undefined8 *)((convexResult->m_hitPointLocal).m_floats + 2);
  *(undefined8 *)(this->m_hitPointWorld).m_floats =
       *(undefined8 *)(convexResult->m_hitPointLocal).m_floats;
  *(undefined8 *)((this->m_hitPointWorld).m_floats + 2) = uVar6;
  return convexResult->m_hitFraction;
}

Assistant:

virtual	btScalar	addSingleResult(LocalConvexResult& convexResult,bool normalInWorldSpace)
		{
//caller already does the filter on the m_closestHitFraction
			btAssert(convexResult.m_hitFraction <= m_closestHitFraction);
						
			m_closestHitFraction = convexResult.m_hitFraction;
			m_hitCollisionObject = convexResult.m_hitCollisionObject;
			if (normalInWorldSpace)
			{
				m_hitNormalWorld = convexResult.m_hitNormalLocal;
			} else
			{
				///need to transform normal into worldspace
				m_hitNormalWorld = m_hitCollisionObject->getWorldTransform().getBasis()*convexResult.m_hitNormalLocal;
			}
			m_hitPointWorld = convexResult.m_hitPointLocal;
			return convexResult.m_hitFraction;
		}